

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QSpinBox::setDisplayIntegerBase(QSpinBox *this,int base)

{
  QSpinBoxPrivate *pQVar1;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QSpinBoxPrivate *d;
  undefined7 in_stack_ffffffffffffffb8;
  bool bVar2;
  undefined4 in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QSpinBox *)0x6912a9);
  bVar2 = (int)in_ESI < 2 || 0x24 < (int)in_ESI;
  if (bVar2) {
    QMessageLogger::QMessageLogger
              (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
               (int)((ulong)pQVar1 >> 0x20),(char *)CONCAT17(bVar2,in_stack_ffffffffffffffb8));
    QMessageLogger::warning
              (local_28,"QSpinBox::setDisplayIntegerBase: Invalid base (%d)",(ulong)in_ESI);
    in_ESI = 10;
  }
  if (in_ESI != *(uint *)&(pQVar1->super_QAbstractSpinBoxPrivate).field_0x3d4) {
    *(uint *)&(pQVar1->super_QAbstractSpinBoxPrivate).field_0x3d4 = in_ESI;
    (**(code **)(*(long *)&(pQVar1->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xc0))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpinBox::setDisplayIntegerBase(int base)
{
    Q_D(QSpinBox);
    // Falls back to base 10 on invalid bases (like QString)
    if (Q_UNLIKELY(base < 2 || base > 36)) {
        qWarning("QSpinBox::setDisplayIntegerBase: Invalid base (%d)", base);
        base = 10;
    }

    if (base != d->displayIntegerBase) {
        d->displayIntegerBase = base;
        d->updateEdit();
    }
}